

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

bool Process::setEnvironmentVariable(String *name,String *value)

{
  usize uVar1;
  int iVar2;
  char *__name;
  char *__value;
  bool bVar3;
  
  uVar1 = value->data->len;
  __name = String::operator_cast_to_char_(name);
  if (uVar1 == 0) {
    iVar2 = unsetenv(__name);
    bVar3 = iVar2 != 0;
  }
  else {
    __value = String::operator_cast_to_char_(value);
    iVar2 = setenv(__name,__value,1);
    bVar3 = iVar2 == 0;
  }
  return bVar3;
}

Assistant:

bool Process::setEnvironmentVariable(const String& name, const String& value)
{
#ifdef _WIN32
  return SetEnvironmentVariable((const char*)name, value.isEmpty() ? 0 : (const char*)value) == TRUE;
#else
  if(value.isEmpty())
    return unsetenv((const char*)name);
  return setenv((const char*)name, (const char*)value, 1) == 0;
#endif
}